

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalyser.cpp
# Opt level: O1

void __thiscall SemanticAnalyser::visit(SemanticAnalyser *this,AssignmentNode *node)

{
  bool bVar1;
  pointer pcVar2;
  element_type *peVar3;
  optional<TypeName> *poVar4;
  mapped_type *__rhs;
  long *plVar5;
  size_type *psVar6;
  bool bVar7;
  optional<std::reference_wrapper<Symbol>_> oVar8;
  string name;
  VariableAnalyser analyser;
  TypeChecker typeChecker;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  string local_d8;
  VariableAnalyser local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  TypeChecker local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  pcVar2 = (node->name_)._M_dataplus._M_p;
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d8,pcVar2,pcVar2 + (node->name_)._M_string_length);
  oVar8 = SymbolTable::lookup(&this->symbols_,&local_d8,0);
  if (((undefined1  [16])
       oVar8.super__Optional_base<std::reference_wrapper<Symbol>,_true,_true>._M_payload.
       super__Optional_payload_base<std::reference_wrapper<Symbol>_> & (undefined1  [16])0x1) ==
      (undefined1  [16])0x0) {
    std::operator+(&local_f8,"Assignment to undeclared variable ",&local_d8);
    reportError(&local_f8,(Node *)node);
  }
  VariableAnalyser::VariableAnalyser(&local_b8);
  (**(code **)(*(long *)oVar8.super__Optional_base<std::reference_wrapper<Symbol>,_true,_true>.
                        _M_payload.super__Optional_payload_base<std::reference_wrapper<Symbol>_>.
                        _M_payload + 0x10))
            (oVar8.super__Optional_base<std::reference_wrapper<Symbol>,_true,_true>._M_payload.
             super__Optional_payload_base<std::reference_wrapper<Symbol>_>._M_payload,&local_b8);
  if (local_b8.symbolValid_ != false) {
    if ((((ulong)local_b8.type_.super__Optional_base<TypeName,_true,_true>._M_payload.
                 super__Optional_payload_base<TypeName> & 0x1ffffffff) == 0x100000001) &&
       (node->operator_ != Assign)) {
      std::operator+(&local_f8,"Cannot perform arithmetic operation on function variable ",&local_d8
                    );
      reportError(&local_f8,(Node *)node);
    }
    peVar3 = (node->value_).super___shared_ptr<ExpressionNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (*(peVar3->super_Node)._vptr_Node[2])(peVar3,this);
    local_80.super_Visitor._vptr_Visitor = (_func_int **)&PTR__Visitor_001f4478;
    local_80.type_.super__Optional_base<TypeName,_true,_true>._M_payload.
    super__Optional_payload_base<TypeName>._M_engaged = false;
    local_80.symbols_ = &this->symbols_;
    (*(((node->value_).super___shared_ptr<ExpressionNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      super_Node)._vptr_Node[2])();
    poVar4 = TypeChecker::getType(&local_80);
    if ((poVar4->super__Optional_base<TypeName,_true,_true>)._M_payload.
        super__Optional_payload_base<TypeName>._M_engaged == true) {
      poVar4 = TypeChecker::getType(&local_80);
      bVar1 = (poVar4->super__Optional_base<TypeName,_true,_true>)._M_payload.
              super__Optional_payload_base<TypeName>._M_engaged;
      bVar7 = bVar1 != local_b8.type_.super__Optional_base<TypeName,_true,_true>._M_payload.
                       super__Optional_payload_base<TypeName>._M_engaged;
      if (bVar1 == true && !bVar7) {
        bVar7 = (poVar4->super__Optional_base<TypeName,_true,_true>)._M_payload.
                super__Optional_payload_base<TypeName>._M_payload._M_value !=
                local_b8.type_.super__Optional_base<TypeName,_true,_true>._M_payload.
                super__Optional_payload_base<TypeName>._M_payload;
      }
      if (bVar7) {
        poVar4 = TypeChecker::getType(&local_80);
        if ((poVar4->super__Optional_base<TypeName,_true,_true>)._M_payload.
            super__Optional_payload_base<TypeName>._M_engaged != false) {
          __rhs = std::__detail::
                  _Map_base<TypeName,_std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<TypeName>,_std::hash<TypeName>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::at((_Map_base<TypeName,_std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<TypeName>,_std::hash<TypeName>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                        *)&TypeNameStrings_abi_cxx11_,(key_type *)poVar4);
          std::operator+(&local_68,"Cannot assign value of type ",__rhs);
          plVar5 = (long *)std::__cxx11::string::append((char *)&local_68);
          local_a0._M_dataplus._M_p = (pointer)*plVar5;
          psVar6 = (size_type *)(plVar5 + 2);
          if ((size_type *)local_a0._M_dataplus._M_p == psVar6) {
            local_a0.field_2._M_allocated_capacity = *psVar6;
            local_a0.field_2._8_8_ = plVar5[3];
            local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
          }
          else {
            local_a0.field_2._M_allocated_capacity = *psVar6;
          }
          local_a0._M_string_length = plVar5[1];
          *plVar5 = (long)psVar6;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          std::operator+(&local_48,&local_a0,&local_d8);
          plVar5 = (long *)std::__cxx11::string::append((char *)&local_48);
          local_f8._M_dataplus._M_p = (pointer)*plVar5;
          psVar6 = (size_type *)(plVar5 + 2);
          if ((size_type *)local_f8._M_dataplus._M_p == psVar6) {
            local_f8.field_2._M_allocated_capacity = *psVar6;
            local_f8.field_2._8_8_ = plVar5[3];
            local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
          }
          else {
            local_f8.field_2._M_allocated_capacity = *psVar6;
          }
          local_f8._M_string_length = plVar5[1];
          *plVar5 = (long)psVar6;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          reportError(&local_f8,(Node *)node);
        }
        std::__throw_bad_optional_access();
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
    return;
  }
  std::operator+(&local_f8,"Assignment to a non-variable symbol ",&local_d8);
  reportError(&local_f8,(Node *)node);
}

Assistant:

void SemanticAnalyser::visit(const AssignmentNode& node) 
{
  const auto name = node.getName();
  const auto symbol = symbols_.lookup(name);
  if(!symbol)
    reportError("Assignment to undeclared variable " + name, node);

  VariableAnalyser analyser{};
  symbol.value().get().accept(analyser);
  if(!analyser.isSymbolValid())
    reportError("Assignment to a non-variable symbol " + name, node);

  if(analyser.getType() == TypeName::Function && node.getOperation() != AssignmentOperator::Assign)
    reportError("Cannot perform arithmetic operation on function variable " + name, node);

  node.getValue()->accept(*this);

  TypeChecker typeChecker{symbols_};
  node.getValue()->accept(typeChecker);

  // Type checker is not able to deduce expression's type when variable was called
  // and in that case getType has no value.
  if(typeChecker.getType().has_value() && typeChecker.getType() != analyser.getType())
    reportError("Cannot assign value of type " + 
      TypeNameStrings.at(typeChecker.getType().value()) + " to variable " + name + "!", node);
}